

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

aphy_error __thiscall
APhyBullet::BulletWorld::removeCharacterController
          (BulletWorld *this,character_controller_ref *character)

{
  __node_base_ptr p_Var1;
  aphy_error aVar2;
  _Node_iterator_base<aphy::ref<aphy::character_controller>,_true> __it;
  
  if (character->counter == (Counter *)0x0) {
    aVar2 = APHY_NULL_POINTER;
  }
  else {
    (*(this->handle->super_btCollisionWorld)._vptr_btCollisionWorld[0x11])
              (this->handle,character->counter->object[1].super_base_interface._vptr_base_interface)
    ;
    p_Var1 = std::
             _Hashtable<aphy::ref<aphy::character_controller>,_aphy::ref<aphy::character_controller>,_std::allocator<aphy::ref<aphy::character_controller>_>,_std::__detail::_Identity,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::_M_find_before_node
                       (&(this->characterControllers)._M_h,
                        (ulong)character->counter %
                        (this->characterControllers)._M_h._M_bucket_count,character,
                        (__hash_code)character->counter);
    __it._M_cur = (__node_type *)0x0;
    if (p_Var1 != (__node_base_ptr)0x0) {
      __it._M_cur = (__node_type *)p_Var1->_M_nxt;
    }
    aVar2 = APHY_OK;
    if (__it._M_cur != (__node_type *)0x0) {
      std::
      _Hashtable<aphy::ref<aphy::character_controller>,_aphy::ref<aphy::character_controller>,_std::allocator<aphy::ref<aphy::character_controller>_>,_std::__detail::_Identity,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::erase(&(this->characterControllers)._M_h,(const_iterator)__it._M_cur);
      aVar2 = APHY_OK;
    }
  }
  return aVar2;
}

Assistant:

aphy_error BulletWorld::addCharacterController(const character_controller_ref &character)
{
    CHECK_POINTER(character);

    handle->addAction(character.as<BulletCharacterController>()->handle);
    characterControllers.insert(character);
    return APHY_OK;
}